

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O1

optional<const_tinyusdz::Prim_*> *
tinyusdz::anon_unknown_28::GetPrimAtPathRec
          (optional<const_tinyusdz::Prim_*> *__return_storage_ptr__,Prim *parent,string *parent_path
          ,Path *path,uint32_t depth)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pPVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  storage_t<const_tinyusdz::Prim_*> sVar7;
  pointer parent_00;
  bool bVar8;
  string abs_path;
  string elementName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_b0;
  string local_90;
  long *local_70;
  storage_t<const_tinyusdz::Prim_*> local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  if (parent == (Prim *)0x0) {
    __return_storage_ptr__->has_value_ = false;
    __return_storage_ptr__->contained = (storage_t<const_tinyusdz::Prim_*>)0x0;
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    pcVar2 = (parent->_elementPath)._prim_part._M_dataplus._M_p;
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,
               pcVar2 + (parent->_elementPath)._prim_part._M_string_length);
    local_50[0] = local_40;
    pcVar2 = (parent_path->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar2,pcVar2 + parent_path->_M_string_length);
    std::__cxx11::string::append((char *)local_50);
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)local_50,(ulong)local_70);
    paVar1 = &local_90.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_90.field_2._M_allocated_capacity = *psVar6;
      local_90.field_2._8_8_ = plVar5[3];
      local_90._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar6;
      local_90._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_90._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    Path::full_path_name_abi_cxx11_(&local_90,path);
    if (local_b0._M_string_length == local_90._M_string_length) {
      if (local_b0._M_string_length == 0) {
        bVar8 = true;
      }
      else {
        iVar4 = bcmp(local_b0._M_dataplus._M_p,local_90._M_dataplus._M_p,local_b0._M_string_length);
        bVar8 = iVar4 == 0;
      }
    }
    else {
      bVar8 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (bVar8) {
      __return_storage_ptr__->has_value_ = true;
      __return_storage_ptr__->contained = (storage_t<const_tinyusdz::Prim_*>)parent;
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
    }
    else {
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      parent_00 = (parent->_children).
                  super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pPVar3 = (parent->_children).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (parent_00 != pPVar3) {
        sVar7 = (storage_t<const_tinyusdz::Prim_*>)__return_storage_ptr__;
        do {
          GetPrimAtPathRec((optional<const_tinyusdz::Prim_*> *)&local_70,parent_00,&local_b0,path,
                           depth + 1);
          if (local_70._0_1_ != (string)0x0) {
            sVar7 = local_68;
          }
          if (local_70._0_1_ == (string)0x1) {
            __return_storage_ptr__->has_value_ = true;
            __return_storage_ptr__->contained = sVar7;
            goto LAB_0019a8cb;
          }
          parent_00 = parent_00 + 1;
        } while (parent_00 != pPVar3);
      }
      __return_storage_ptr__->has_value_ = false;
      __return_storage_ptr__->contained = (storage_t<const_tinyusdz::Prim_*>)0x0;
    }
LAB_0019a8cb:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<const Prim *> GetPrimAtPathRec(const Prim *parent,
                                                const std::string &parent_path,
                                                const Path &path,
                                                const uint32_t depth) {

  if (!parent) {
    return nonstd::nullopt;
  }

  std::string abs_path;
  // if (auto pv = GetPrimElementName(parent->data())) {
  {
    std::string elementName = parent->element_path().prim_part();
    // DCOUT(pprint::Indent(depth) << "Prim elementName = " << elementName);
    // DCOUT(pprint::Indent(depth) << "Given Path = " << path);
    //  fully absolute path
    abs_path = parent_path + "/" + elementName;
    // DCOUT(pprint::Indent(depth) << "abs_path = " << abs_path);
    // DCOUT(pprint::Indent(depth)
    //       << "queriying path = " << path.full_path_name());
    if (abs_path == path.full_path_name()) {
      // DCOUT(pprint::Indent(depth)
      //       << "Got it! Found Prim at Path = " << abs_path);
      return parent;
    }
  }

  // DCOUT(pprint::Indent(depth)
  //       << "# of children : " << parent->children().size());
  for (const auto &child : parent->children()) {
    // const std::string &p = parent->elementPath.full_path_name();
    // DCOUT(pprint::Indent(depth + 1) << "Parent path : " << abs_path);
    if (auto pv = GetPrimAtPathRec(&child, abs_path, path, depth + 1)) {
      return pv.value();
    }
  }

  return nonstd::nullopt;
}